

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall shaping_clipper::generate_hann_window(shaping_clipper *this)

{
  int iVar1;
  reference pvVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  int local_20;
  float value;
  int i;
  int window_size;
  double pi;
  shaping_clipper *this_local;
  
  dVar4 = acos(-1.0);
  iVar1 = this->size * this->max_oversample;
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    dVar5 = cos((dVar4 * 2.0 * (double)local_20) / (double)iVar1);
    fVar3 = (float)((1.0 - dVar5) * 0.5);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&this->window,(long)local_20);
    *pvVar2 = fVar3;
    if (fVar3 <= 0.1) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = 1.0 / fVar3;
    }
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->inv_window,(long)local_20);
    *pvVar2 = fVar3;
  }
  return;
}

Assistant:

void shaping_clipper::generate_hann_window() {
    double pi = acos(-1);
    int window_size = this->size * this->max_oversample;
    for (int i = 0; i < window_size; i++) {
        float value = 0.5 * (1 - cos(2 * pi * i / window_size));
        this->window[i] = value;
        // 1/window to calculate unwindowed peak.
        this->inv_window[i] = value > 0.1 ? 1.0 / value : 0;
    }
}